

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLReader::xcodeMoreChars
          (XMLReader *this,XMLCh *bufToFill,uchar *charSizes,XMLSize_t maxChars)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  XMLSize_t bytesLeft;
  long lStack_40;
  bool needMode;
  XMLSize_t bytesEaten;
  XMLSize_t charsDone;
  XMLSize_t maxChars_local;
  uchar *charSizes_local;
  XMLCh *bufToFill_local;
  XMLReader *this_local;
  
  bytesEaten = 0;
  lStack_40 = 0;
  bVar1 = false;
  charsDone = maxChars;
  maxChars_local = (XMLSize_t)charSizes;
  charSizes_local = (uchar *)bufToFill;
  bufToFill_local = (XMLCh *)this;
  while( true ) {
    if (lStack_40 != 0) {
      return bytesEaten;
    }
    uVar3 = this->fRawBytesAvail - this->fRawBufIndex;
    if ((((bVar1) || (this->fRawBytesAvail == this->fRawBufIndex)) || (uVar3 < this->fLowWaterMark))
       && ((refreshRawBuffer(this), this->fRawBytesAvail == 0 ||
           ((bVar1 && (uVar3 == this->fRawBytesAvail - this->fRawBufIndex)))))) break;
    iVar2 = (*this->fTranscoder->_vptr_XMLTranscoder[2])
                      (this->fTranscoder,this->fRawByteBuf + this->fRawBufIndex,
                       this->fRawBytesAvail - this->fRawBufIndex,charSizes_local,charsDone,
                       &stack0xffffffffffffffc0,maxChars_local);
    bytesEaten = CONCAT44(extraout_var,iVar2);
    if (lStack_40 == 0) {
      bVar1 = true;
    }
    else {
      this->fRawBufIndex = lStack_40 + this->fRawBufIndex;
    }
  }
  return 0;
}

Assistant:

XMLSize_t
XMLReader::xcodeMoreChars(          XMLCh* const            bufToFill
                            ,       unsigned char* const    charSizes
                            , const XMLSize_t               maxChars)
{
    XMLSize_t charsDone = 0;
    XMLSize_t bytesEaten = 0;
    bool needMode = false;

    while (!bytesEaten)
    {
        // If our raw buffer is low, then lets load up another batch of
        // raw bytes now.
        //
        XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;
        if (needMode || bytesLeft == 0 || bytesLeft < fLowWaterMark)
        {
            refreshRawBuffer();

            // If there are no characters or if we need more but didn't get
            // any, return zero now.
            //
            if (fRawBytesAvail == 0 ||
                (needMode && (bytesLeft == fRawBytesAvail - fRawBufIndex)))
                return 0;
        }

        // Ask the transcoder to internalize another batch of chars. It is
        // possible that there is data in the raw buffer but the transcoder
        // is unable to produce anything because transcoding of multi-byte
        // encodings may have left a few bytes representing a partial
        // character in the buffer that can't be used until the next chunk
        // (and the rest of the character) is read. In this case set the
        // needMore flag and try again.
        //

        charsDone = fTranscoder->transcodeFrom
          (
            &fRawByteBuf[fRawBufIndex]
            , fRawBytesAvail - fRawBufIndex
            , bufToFill
            , maxChars
            , bytesEaten
            , charSizes
          );

        if (bytesEaten == 0)
            needMode = true;
        else
            fRawBufIndex += bytesEaten;
    }

    return charsDone;
}